

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

void __thiscall nodecpp::log::LogTransport::~LogTransport(LogTransport *this)

{
  size_t *psVar1;
  size_t sVar2;
  LogBufferBaseData *pLVar3;
  unique_lock<std::mutex> local_28;
  
  pLVar3 = this->logData;
  if (pLVar3 != (LogBufferBaseData *)0x0) {
    local_28._M_device = &pLVar3->mx;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    psVar1 = &pLVar3->refCounter;
    *psVar1 = *psVar1 - 1;
    sVar2 = *psVar1;
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    if ((sVar2 == 0) && (this->logData != (LogBufferBaseData *)0x0)) {
      LogBufferBaseData::deinit(this->logData);
    }
  }
  std::condition_variable::~condition_variable(&(this->gww).w);
  return;
}

Assistant:

~LogTransport()
		{
			if ( logData != nullptr )
			{
				size_t refCtr = logData->removeRef();
				if ( refCtr == 0 && logData != nullptr ) 
				{
					logData->deinit();
				}
			}
		}